

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter_tree.cc
# Opt level: O3

void __thiscall re2::PrefilterTree::Add(PrefilterTree *this,Prefilter *f)

{
  pointer *pppPVar1;
  iterator __position;
  bool bVar2;
  Prefilter *local_198;
  LogMessage local_190;
  
  local_198 = f;
  if (this->compiled_ == true) {
    LogMessage::LogMessage
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prefilter_tree.cc"
               ,0x47,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_190.str_,"Add after Compile.",0x12);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_190);
    return;
  }
  if (f != (Prefilter *)0x0) {
    bVar2 = KeepPart(f,0);
    if (bVar2) goto LAB_0011f5c2;
    Prefilter::~Prefilter(f);
    operator_delete(f);
    local_198 = (Prefilter *)0x0;
  }
  f = (Prefilter *)0x0;
LAB_0011f5c2:
  __position._M_current =
       (this->prefilter_vec_).
       super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->prefilter_vec_).super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<re2::Prefilter*,std::allocator<re2::Prefilter*>>::
    _M_realloc_insert<re2::Prefilter*const&>
              ((vector<re2::Prefilter*,std::allocator<re2::Prefilter*>> *)&this->prefilter_vec_,
               __position,&local_198);
  }
  else {
    *__position._M_current = f;
    pppPVar1 = &(this->prefilter_vec_).
                super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppPVar1 = *pppPVar1 + 1;
  }
  return;
}

Assistant:

void PrefilterTree::Add(Prefilter *f) {
  if (compiled_) {
    LOG(DFATAL) << "Add after Compile.";
    return;
  }
  if (f != NULL && !KeepPart(f, 0)) {
    delete f;
    f = NULL;
  }

  prefilter_vec_.push_back(f);
}